

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.c
# Opt level: O0

void run_framework(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ALLEGRO_EVENT event;
  _Bool paused;
  _Bool background_mode;
  int i;
  int next_state;
  int need_to_redraw;
  int done;
  bool local_6d;
  undefined4 local_60 [4];
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 local_38;
  undefined8 in_stack_ffffffffffffffd0;
  int local_10;
  
  local_6d = false;
  bVar2 = true;
  bVar3 = false;
  bVar1 = false;
  (*state[current_state].init)();
  transition = create_transition((GAMESTATE *)in_stack_ffffffffffffffc0,
                                 (GAMESTATE *)in_stack_ffffffffffffffb8,
                                 (double)in_stack_ffffffffffffffb0);
  timer = 0;
  do {
    do {
      if (local_6d) {
        return;
      }
      al_wait_for_event(event_queue,local_60);
      switch(local_60[0]) {
      case 1:
        gamepad_event((ALLEGRO_EVENT *)local_60);
        break;
      case 2:
        gamepad_event((ALLEGRO_EVENT *)local_60);
        break;
      case 3:
        gamepad_event((ALLEGRO_EVENT *)local_60);
        break;
      case 10:
        keyboard_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0xb:
        keyboard_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0xc:
        keyboard_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0x14:
        mouse_handle_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0x15:
        mouse_handle_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0x16:
        mouse_handle_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0x1e:
        if (!bVar1) {
          timer = timer + 1;
        }
        break;
      case 0x29:
        al_acknowledge_resize(screen);
        screen_width = al_get_display_width(screen);
        screen_height = al_get_display_height(screen);
        if (fullscreen == 0) {
          window_width = screen_width;
          window_height = screen_height;
        }
        break;
      case 0x2a:
        closed = 1;
        break;
      case 0x2d:
        bVar1 = false;
        break;
      case 0x2e:
        bVar1 = true;
        break;
      case 0x2f:
        if ((local_38 == 2) || (local_38 == 8)) {
          screen_orientation = local_38;
        }
        break;
      case 0x30:
        bVar3 = true;
        al_acknowledge_drawing_halt(screen);
        break;
      case 0x31:
        bVar3 = false;
        break;
      case 0x32:
        gamepad_event((ALLEGRO_EVENT *)local_60);
        break;
      case 0x33:
        gamepad_event((ALLEGRO_EVENT *)local_60);
      }
      uVar7 = al_is_event_queue_empty(event_queue);
    } while ((uVar7 & 1) == 0);
    while (0 < timer) {
      timer = timer + -1;
      _Var4 = key_pressed(0x3a);
      if (_Var4) {
        if (F12 == 0) {
          F12 = 1;
          take_screenshot((SCREENSHOT *)in_stack_ffffffffffffffd0);
        }
      }
      else {
        F12 = 0;
      }
      if (transition == (TRANSITION *)0x0) {
        iVar5 = (*state[current_state].update)();
        if (iVar5 == -1) {
          transition = create_transition((GAMESTATE *)in_stack_ffffffffffffffc0,
                                         (GAMESTATE *)in_stack_ffffffffffffffb8,
                                         (double)in_stack_ffffffffffffffb0);
          last_state = current_state;
          current_state = -1;
          break;
        }
        iVar6 = (*state[current_state].id)();
        if (iVar5 != iVar6) {
          last_state = current_state;
          for (local_10 = 0; local_10 < state_count; local_10 = local_10 + 1) {
            iVar6 = (*state[local_10].id)();
            if (iVar6 == iVar5) {
              (*state[local_10].init)();
              transition = create_transition((GAMESTATE *)in_stack_ffffffffffffffc0,
                                             (GAMESTATE *)in_stack_ffffffffffffffb8,
                                             (double)in_stack_ffffffffffffffb0);
              current_state = local_10;
              break;
            }
          }
        }
      }
      else {
        iVar5 = update_transition(transition);
        if (iVar5 == 0) {
          destroy_transition((TRANSITION *)0x10a348);
          transition = (TRANSITION *)0x0;
          if (state[last_state].deinit != (_func_void *)0x0) {
            (*state[last_state].deinit)();
          }
          if (current_state == -1) {
            local_6d = true;
            break;
          }
        }
      }
      bVar2 = true;
      fps_tick(fps);
      keyboard_tick();
      mouse_tick();
    }
    if ((bVar2) && (!bVar3)) {
      draw_framework();
      bVar2 = false;
      fps_frame(fps);
    }
    local_6d = local_6d || closed != 0;
  } while( true );
}

Assistant:

void run_framework(void)
{
   int done = false;            /* will become true when we're ready to close */
   int need_to_redraw = 1;      /* do we need to draw the next frame? */
   int next_state = current_state;
   int i;
   bool background_mode = false;
   bool paused = false;

   /* Initialize the first game screen. */
   state[current_state].init();

   /* Create a transition animation so that the first screen doesn't just
      pop up but comes in a nice animation that lasts 0.3 seconds. */
   transition = create_transition(NULL, &state[current_state], 0.3f);

   timer = 0;

   /* Do the main loop; until we're not done. */
   while (!done) {

      ALLEGRO_EVENT event;

      al_wait_for_event(event_queue, &event);
      switch (event.type) {
         
         case ALLEGRO_EVENT_MOUSE_AXES:
            mouse_handle_event(&event);
            break;
         
         case ALLEGRO_EVENT_MOUSE_BUTTON_DOWN:
            mouse_handle_event(&event);
            break;
         
         case ALLEGRO_EVENT_MOUSE_BUTTON_UP:
            mouse_handle_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_DOWN:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_CHAR:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_UP:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_BUTTON_DOWN:
            gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_BUTTON_UP:
            gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_AXIS:
            gamepad_event(&event);
            break;
        
         case ALLEGRO_EVENT_TOUCH_BEGIN:
            gamepad_event(&event);
            break;
         case ALLEGRO_EVENT_TOUCH_END:
              gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            closed = true;
            break;
        
         case ALLEGRO_EVENT_TIMER:
            if (!paused)
               timer++;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_ORIENTATION:
            if (event.display.orientation == ALLEGRO_DISPLAY_ORIENTATION_90_DEGREES ||
                event.display.orientation == ALLEGRO_DISPLAY_ORIENTATION_270_DEGREES)
               screen_orientation = event.display.orientation;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(screen);
            screen_width = al_get_display_width(screen);
            screen_height = al_get_display_height(screen);
            if (fullscreen == 0) {
               window_width = screen_width;
               window_height = screen_height;
            }
            break;
         
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background_mode = true;
            al_acknowledge_drawing_halt(screen);
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background_mode = false;
            break;
            
         case ALLEGRO_EVENT_DISPLAY_SWITCH_OUT:
            paused = true;
            break;
            
         case ALLEGRO_EVENT_DISPLAY_SWITCH_IN:
            paused = false;
            break;
            
      }
      
      if (!al_is_event_queue_empty(event_queue)) continue;

      /* Check if the timer has ticked. */
      while (timer > 0) {
         --timer;

         /* See if the user pressed F12 to see if the user wants to take
            a screenshot. */
         if (key_pressed(ALLEGRO_KEY_F12)) {
            /* See if the F12 key was already pressed before. */
            if (F12 == 0) {
               /* The user just pressed F12 (it wasn't pressed before), so
                  remember this and take a screenshot! */
               F12 = 1;
               take_screenshot(screenshot);
            }
         } else {
            /* Remember for later that F12 is not pressed. */
            F12 = 0;
         }

         /* Do one frame of logic. If we're in between states, then update
            the transition animation module, otherwise update the current
            game state. */
         if (transition) {
            /* Advance the transition animation. If it returns non-zero, it
               means the animation finished playing. */
            if (update_transition(transition) == 0) {
               /* Destroy the animation, we're done with it. */
               destroy_transition(transition);
               transition = NULL;

               /* Complete the transition to the new state by deiniting the
                  previous one. */
               if (state[last_state].deinit) {
                  state[last_state].deinit();
               }

               /* Stop the main loop if there is no more game screens. */
               if (current_state == DEMO_STATE_EXIT) {
                  done = true;
                  break;
               }
            }
         }
         /* We're not in between states, so update the current one. */
         else {
            /* Update the current state. It returns the ID of the
               next state. */

            next_state = state[current_state].update();

            /* Did the current state just close the game? */
            if (next_state == DEMO_STATE_EXIT) {
               /* Create a transition so the game doesn't just close but
                  instead goes out in a nice animation. */
               transition =
                  create_transition(&state[current_state], NULL, 0.3f);
               last_state = current_state;
               current_state = next_state;
               break;
            }
            /* If the next state is different then the current one, then
               start a transition. */
            else if (next_state != state[current_state].id()) {
               last_state = current_state;

               /* Find the index of the next state in the state array.
                  Note that ID of a state is not the same as its index in
                  the array! */
               for (i = 0; i < state_count; i++) {
                  /* Did we find it? */
                  if (state[i].id() == next_state) {
                     /* We found the new state. Initialize it and start the
                        transition animation. */
                     state[i].init();
                     transition =
                        create_transition(&state[current_state], &state[i],
                                          0.3f);
                     current_state = i;
                     break;
                  }
               }
            }
         }

         /* We just did one logic frame so we assume we will need to update
            the visuals to reflect the changes this logic frame made. */
         need_to_redraw = 1;

         /* Let the framerate counter know that one logic frame was run. */
         fps_tick(fps);

         keyboard_tick();
         mouse_tick();
      }

      /* In case a frame of logic has just been run or the user wants
         unlimited framerate, we must redraw the screen. */
      if (need_to_redraw == 1 && !background_mode) {
         /* Actually do the drawing. */
         draw_framework();

         /* Make sure we don't draw too many times. */
         need_to_redraw = 0;

         /* Let the framerate counter know that we just drew a frame. */
         fps_frame(fps);
      }

      /* Check if the user pressed the close icon. */
      done = done || closed;

   }
}